

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int decodeDpcm(string *in_file_path,uchar *dpcm,int dpcm_frames,int dpcm_initial_volume,
              int bias_level,bool outputToFile,double dst_rate)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  StkFrames decode_sample;
  string local_80;
  StkFrames local_60;
  
  stk::StkFrames::StkFrames(&local_60,dpcm_frames,1);
  if (dpcm_frames < 1) {
    iVar3 = 0;
  }
  else {
    uVar4 = 0;
    iVar3 = 0;
    do {
      bVar5 = (dpcm[uVar4 >> 3 & 0x1fffffff] & '\x01' << ((byte)uVar4 & 7)) != 0;
      bVar1 = dpcm_initial_volume < 0x7e;
      if (!bVar5) {
        bVar1 = 1 < dpcm_initial_volume;
      }
      iVar2 = (uint)bVar5 * 4 + -2;
      if (!bVar1) {
        iVar2 = 0;
      }
      dpcm_initial_volume = dpcm_initial_volume + iVar2;
      if (iVar3 <= dpcm_initial_volume) {
        iVar3 = dpcm_initial_volume;
      }
      local_60.data_[uVar4] =
           (159.79 / (22638.0 / (double)dpcm_initial_volume + 100.0)) / 0.5771522095 -
           (159.79 / (22638.0 / (double)bias_level + 100.0)) / 0.5771522095;
      uVar4 = uVar4 + 1;
    } while ((uint)dpcm_frames != uVar4);
  }
  if (outputToFile) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"_dpcm","");
    outputBufferToFile(in_file_path,&local_60,&local_80,dst_rate);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  stk::StkFrames::~StkFrames(&local_60);
  return iVar3;
}

Assistant:

int decodeDpcm(const std::string &in_file_path, const unsigned char *dpcm,
			   int dpcm_frames, int dpcm_initial_volume, int bias_level, bool outputToFile,
			   double dst_rate)
{
	int volume_max = 0;
	
	stk::StkFrames decode_sample(dpcm_frames, 1);
	int now_sample = dpcm_initial_volume;
	for (int i=0; i<dpcm_frames; ++i) {
		if (dpcm[i / 8] & dpcmBitMask(i)) {
			if (now_sample <= 125) {
				now_sample += 2;
			}
		}
		else {
			if (now_sample >= 2) {
				now_sample -= 2;
			}
		}
		
		if (volume_max < now_sample) {
			volume_max = now_sample;
		}
		
		// 実機非線形特性
		decode_sample[i] = linearToDacCurve(now_sample) - linearToDacCurve(bias_level);
	}
	if (outputToFile) {
		outputBufferToFile(in_file_path, decode_sample, "_dpcm", dst_rate);
	}
	
	return volume_max;
}